

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_amount.cpp
# Opt level: O0

void __thiscall
Amount_GetByteDataTest_Test::~Amount_GetByteDataTest_Test(Amount_GetByteDataTest_Test *this)

{
  Amount_GetByteDataTest_Test *this_local;
  
  ~Amount_GetByteDataTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Amount, GetByteDataTest) {
  int64_t base_satoshi_val = 12345;
  Amount base_amt = Amount::CreateBySatoshiAmount(base_satoshi_val);
  ByteData byte_data;
  EXPECT_NO_THROW((byte_data = base_amt.GetByteData()));
  EXPECT_STREQ("3930000000000000", byte_data.GetHex().c_str());

  int64_t bit64_satoshi_val = 2090000000000000;
  Amount bit64_amt = Amount::CreateBySatoshiAmount(bit64_satoshi_val);
  EXPECT_NO_THROW((byte_data = bit64_amt.GetByteData()));
  EXPECT_STREQ("00a0940bd86c0700", byte_data.GetHex().c_str());
}